

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# square.cpp
# Opt level: O2

void calc<float>(options2 *opt)

{
  string *__lhs;
  long lVar1;
  bool bVar2;
  ostream *poVar3;
  ostream *this;
  invalid_argument *this_00;
  float Jx;
  float Jy;
  float fVar4;
  float fVar5;
  root_type rVar6;
  float fVar7;
  float fVar8;
  fvar<float,_2UL> fVar9;
  fvar<float,_2UL> beta;
  fvar<float,_2UL> beta_00;
  fvar<float,_2UL> fVar10;
  
  Jx = convert<float>(&opt->Jx);
  Jy = convert<float>(&opt->Jy);
  __lhs = &opt->Tmin;
  bVar2 = std::operator==(__lhs,"tc");
  if (!bVar2) {
    bVar2 = std::operator==(__lhs,"Tc");
    if (!bVar2) {
      fVar8 = convert<float>(__lhs);
      fVar5 = convert<float>(&opt->Tmax);
      fVar4 = convert<float>(&opt->dT);
      goto LAB_001181c1;
    }
  }
  fVar4 = ising::tc::square<float>(Jx,Jy);
  fVar5 = fVar4;
  fVar8 = fVar4;
LAB_001181c1:
  lVar1 = std::cout;
  if ((fVar5 < 0.0) || (fVar8 < 0.0)) {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_00,"Temperature should be positive");
  }
  else if (fVar5 < fVar8) {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_00,"Tmax should be larger than Tmin");
  }
  else {
    if (0.0 < fVar4) {
      *(uint *)(std::runtime_error::runtime_error + *(long *)(std::cout + -0x18)) =
           *(uint *)(std::runtime_error::runtime_error + *(long *)(std::cout + -0x18)) & 0xfffffefb
           | 0x100;
      *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(lVar1 + -0x18)) = 6;
      poVar3 = std::operator<<((ostream *)&std::cout,"# lattice: square\n");
      poVar3 = std::operator<<(poVar3,"# precision: ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,6);
      poVar3 = std::endl<char,std::char_traits<char>>(poVar3);
      std::operator<<(poVar3,"# Lx Ly Jx Jy T 1/T F/N E/N C/N\n");
      for (; fVar8 < fVar4 * 0.0001 + fVar5; fVar8 = fVar8 + fVar4) {
        fVar7 = 1.0 / fVar8;
        fVar10.v._M_elems[1] = 1.0;
        fVar10.v._M_elems[0] = fVar7;
        fVar10.v._M_elems[2] = 0.0;
        fVar10 = ising::free_energy::square::
                 infinite<float,boost::math::differentiation::autodiff_v1::detail::fvar<float,2ul>>
                           ((square *)poVar3,Jx,Jy,fVar10);
        poVar3 = std::operator<<((ostream *)&std::cout,"inf inf ");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,Jx);
        poVar3 = std::operator<<(poVar3,' ');
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,Jy);
        poVar3 = std::operator<<(poVar3,' ');
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,fVar8);
        poVar3 = std::operator<<(poVar3,' ');
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,fVar7);
        this = std::operator<<(poVar3,' ');
        fVar9.v._M_elems[1] = 1.0;
        fVar9.v._M_elems[0] = fVar7;
        fVar9.v._M_elems[2] = 0.0;
        rVar6 = ising::free_energy::
                free_energy<boost::math::differentiation::autodiff_v1::detail::fvar<float,2ul>>
                          ((free_energy *)poVar3,fVar10,fVar9);
        poVar3 = (ostream *)std::ostream::operator<<(this,rVar6);
        poVar3 = std::operator<<(poVar3,' ');
        beta.v._M_elems[1] = 1.0;
        beta.v._M_elems[0] = fVar7;
        beta.v._M_elems[2] = 0.0;
        rVar6 = ising::free_energy::
                energy<boost::math::differentiation::autodiff_v1::detail::fvar<float,2ul>>
                          (fVar10,beta);
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,rVar6);
        poVar3 = std::operator<<(poVar3,' ');
        beta_00.v._M_elems[1] = 1.0;
        beta_00.v._M_elems[0] = fVar7;
        beta_00.v._M_elems[2] = 0.0;
        rVar6 = ising::free_energy::
                specific_heat<boost::math::differentiation::autodiff_v1::detail::fvar<float,2ul>>
                          (fVar10,beta_00);
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,rVar6);
        std::endl<char,std::char_traits<char>>(poVar3);
      }
      return;
    }
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_00,"dT should be positive");
  }
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

void calc(const options2& opt) {
  using namespace ising::free_energy;
  typedef T real_t;
  real_t Jx = convert<real_t>(opt.Jx);
  real_t Jy = convert<real_t>(opt.Jy);
  real_t Tmin, Tmax, dT;
  if (opt.Tmin == "tc" || opt.Tmin == "Tc") {
    Tmin = Tmax = dT = ising::tc::square(Jx, Jy);
  } else {
    Tmin = convert<real_t>(opt.Tmin);
    Tmax = convert<real_t>(opt.Tmax);
    dT = convert<real_t>(opt.dT);
  }
  if (Tmin < 0 || Tmax < 0)
    throw(std::invalid_argument("Temperature should be positive"));
  if (Tmin > Tmax)
    throw(std::invalid_argument("Tmax should be larger than Tmin"));
  if (dT <= 0)
    throw(std::invalid_argument("dT should be positive"));
  std::cout << std::scientific
            << std::setprecision(std::numeric_limits<real_t>::digits10)
            << "# lattice: square\n"
            << "# precision: " << std::numeric_limits<real_t>::digits10
            << std::endl
            << "# Lx Ly Jx Jy T 1/T F/N E/N C/N\n";
  for (auto t = Tmin; t < Tmax + 1e-4 * dT; t += dT) {
    auto beta = boost::math::differentiation::make_fvar<real_t, 2>(1 / t);
    auto f = square::infinite(Jx, Jy, beta);
    std::cout << "inf inf " << Jx << ' ' << Jy << ' ' << t << ' ' << (1 / t)
              << ' ' << free_energy(f, beta) << ' ' << energy(f, beta) << ' '
              << specific_heat(f, beta) << std::endl;
  }
}